

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O2

void __thiscall
Assimp::FBX::Node::AddChild<std::__cxx11::string>
          (Node *this,string *name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more)

{
  Node c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [112];
  
  Node((Node *)local_80,name);
  std::__cxx11::string::string((string *)&local_a0,(string *)more);
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<std::__cxx11::string&>
            ((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
              *)(local_80 + 0x20),&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,(value_type *)local_80);
  ~Node((Node *)local_80);
  return;
}

Assistant:

void AddChild(
        const std::string& name,
        More... more
    ) {
        FBX::Node c(name);
        c.AddProperties(more...);
        children.push_back(c);
    }